

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall
Plan::UnmarkDependents
          (Plan *this,Node *node,set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *dependents
          )

{
  const_iterator this_00;
  bool bVar1;
  vector<Edge_*,_std::allocator<Edge_*>_> *pvVar2;
  reference ppEVar3;
  reference ppNVar4;
  pair<std::_Rb_tree_const_iterator<Node_*>,_bool> pVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_58;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_50;
  iterator o;
  _Self local_40;
  iterator want_e;
  Edge *edge;
  __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_28;
  const_iterator oe;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *dependents_local;
  Node *node_local;
  Plan *this_local;
  
  oe._M_current = (Edge **)dependents;
  pvVar2 = Node::out_edges(node);
  local_28._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(pvVar2);
  while( true ) {
    pvVar2 = Node::out_edges(node);
    edge = (Edge *)std::vector<Edge_*,_std::allocator<Edge_*>_>::end(pvVar2);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                        *)&edge);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_28);
    want_e._M_node = (_Base_ptr)*ppEVar3;
    local_40._M_node =
         (_Base_ptr)
         std::
         map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
         ::find(&this->want_,(key_type *)&want_e);
    o._M_current = (Node **)std::
                            map<Edge_*,_Plan::Want,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                            ::end(&this->want_);
    bVar1 = std::operator==(&local_40,(_Self *)&o);
    if ((!bVar1) && (*(int *)&want_e._M_node[3]._M_parent != 0)) {
      *(undefined4 *)&want_e._M_node[3]._M_parent = 0;
      local_50._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               &want_e._M_node[1]._M_parent);
      while( true ) {
        local_58._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                ((vector<Node_*,_std::allocator<Node_*>_> *)
                                 &want_e._M_node[1]._M_parent);
        bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
        this_00 = oe;
        if (!bVar1) break;
        ppNVar4 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_50);
        pVar5 = std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::insert
                          ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)
                           this_00._M_current,ppNVar4);
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          ppNVar4 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_50);
          UnmarkDependents(this,*ppNVar4,
                           (set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)oe._M_current)
          ;
        }
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_50);
      }
    }
    __gnu_cxx::__normal_iterator<Edge_*const_*,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
    operator++(&local_28);
  }
  return;
}

Assistant:

void Plan::UnmarkDependents(const Node* node, set<Node*>* dependents) {
  for (vector<Edge*>::const_iterator oe = node->out_edges().begin();
       oe != node->out_edges().end(); ++oe) {
    Edge* edge = *oe;

    map<Edge*, Want>::iterator want_e = want_.find(edge);
    if (want_e == want_.end())
      continue;

    if (edge->mark_ != Edge::VisitNone) {
      edge->mark_ = Edge::VisitNone;
      for (vector<Node*>::iterator o = edge->outputs_.begin();
           o != edge->outputs_.end(); ++o) {
        if (dependents->insert(*o).second)
          UnmarkDependents(*o, dependents);
      }
    }
  }
}